

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Deserializer.hpp
# Opt level: O0

void mserialize::detail::BuiltinDeserializer<boost::optional<int>,_void>::deserialize<InputStream>
               (optional<int> *opt,InputStream *istream)

{
  undefined8 *in_RDI;
  uint8_t discriminator;
  InputStream *in_stack_ffffffffffffffd8;
  undefined4 in_stack_ffffffffffffffe0;
  undefined4 in_stack_ffffffffffffffe4;
  undefined4 uStack_18;
  undefined1 local_11;
  
  deserialize<unsigned_char,InputStream>
            ((uchar *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
             in_stack_ffffffffffffffd8);
  if (local_11 == '\0') {
    boost::optional<int>::optional((optional<int> *)0x16be81);
    *in_RDI = CONCAT44(uStack_18,in_stack_ffffffffffffffe4);
  }
  else {
    BuiltinDeserializer<boost::optional<int>,void>::make_nonempty<boost::optional<int>>
              ((optional<int> *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0));
    boost::optional<int>::operator*((optional<int> *)0x16be68);
    deserialize<int,InputStream>
              ((int *)CONCAT44(in_stack_ffffffffffffffe4,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffd8);
  }
  return;
}

Assistant:

static void deserialize(Optional& opt, InputStream& istream)
  {
    std::uint8_t discriminator;
    mserialize::deserialize(discriminator, istream);
    if (discriminator)
    {
      assert(discriminator == 1 && "Discriminator of non-empty optional must be 1");
      make_nonempty(opt);
      mserialize::deserialize(*opt, istream);
    }
    else
    {
      opt = {};
    }
  }